

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int MemHashInit(unqlite_kv_engine *pKvEngine,int iPageSize)

{
  int iVar1;
  unqlite_kv_io *puVar2;
  ulong uVar3;
  
  SyMemBackendInitFromParent((SyMemBackend *)(pKvEngine + 1),&sUnqlMPGlobal.sAllocator);
  pKvEngine[0x18].pIo = (unqlite_kv_io *)MemHashFunc;
  pKvEngine[0x19].pIo = (unqlite_kv_io *)SyMemcmp;
  puVar2 = (unqlite_kv_io *)SyMemBackendAlloc((SyMemBackend *)(pKvEngine + 1),0x200);
  pKvEngine[0x1b].pIo = puVar2;
  if (puVar2 == (unqlite_kv_io *)0x0) {
    iVar1 = -1;
  }
  else {
    uVar3 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&puVar2->pHandle + uVar3 + 4) = 0;
      uVar3 = uVar3 + 4;
    } while (uVar3 < 0x1fc);
    pKvEngine[0x1a].pIo = (unqlite_kv_io *)0x4000000000;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int MemHashInit(unqlite_kv_engine *pKvEngine,int iPageSize)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKvEngine;
	/* Note that this instance is already zeroed */	
	/* Memory backend */
	SyMemBackendInitFromParent(&pEngine->sAlloc,unqliteExportMemBackend());
//#if defined(UNQLITE_ENABLE_THREADS)
//	/* Already protected by the upper layers */
//	SyMemBackendDisbaleMutexing(&pEngine->sAlloc);
//#endif
	/* Default hash & comparison function */
	pEngine->xHash = MemHashFunc;
	pEngine->xCmp = SyMemcmp;
	/* Allocate a new bucket */
	pEngine->apBucket = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,MEM_HASH_BUCKET_SIZE * sizeof(mem_hash_record *));
	if( pEngine->apBucket == 0 ){
		SXUNUSED(iPageSize); /* cc warning */
		return UNQLITE_NOMEM;
	}
	/* Zero the bucket */
	SyZero(pEngine->apBucket,MEM_HASH_BUCKET_SIZE * sizeof(mem_hash_record *));
	pEngine->nRecord = 0;
	pEngine->nBucket = MEM_HASH_BUCKET_SIZE;
	return UNQLITE_OK;
}